

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_pcg.c
# Opt level: O0

SUNLinearSolver SUNLinSol_PCG(N_Vector y,int pretype,int maxl,SUNContext sunctx)

{
  SUNLinearSolver p_Var1;
  int *piVar2;
  undefined8 uVar3;
  undefined8 in_RCX;
  int in_EDX;
  int in_ESI;
  undefined8 in_RDI;
  SUNLinearSolverContent_PCG content;
  SUNLinearSolver S;
  SUNContext sunctx_local_scope_;
  int local_10;
  int local_c;
  
  local_c = in_ESI;
  if ((((in_ESI != 0) && (in_ESI != 1)) && (in_ESI != 2)) && (in_ESI != 3)) {
    local_c = 0;
  }
  local_10 = in_EDX;
  if (in_EDX < 1) {
    local_10 = 5;
  }
  p_Var1 = (SUNLinearSolver)SUNLinSolNewEmpty(in_RCX);
  p_Var1->ops->gettype = SUNLinSolGetType_PCG;
  p_Var1->ops->getid = SUNLinSolGetID_PCG;
  p_Var1->ops->setatimes = SUNLinSolSetATimes_PCG;
  p_Var1->ops->setpreconditioner = SUNLinSolSetPreconditioner_PCG;
  p_Var1->ops->setscalingvectors = SUNLinSolSetScalingVectors_PCG;
  p_Var1->ops->setzeroguess = SUNLinSolSetZeroGuess_PCG;
  p_Var1->ops->initialize = SUNLinSolInitialize_PCG;
  p_Var1->ops->setup = SUNLinSolSetup_PCG;
  p_Var1->ops->solve = SUNLinSolSolve_PCG;
  p_Var1->ops->numiters = SUNLinSolNumIters_PCG;
  p_Var1->ops->resnorm = SUNLinSolResNorm_PCG;
  p_Var1->ops->resid = SUNLinSolResid_PCG;
  p_Var1->ops->lastflag = SUNLinSolLastFlag_PCG;
  p_Var1->ops->space = SUNLinSolSpace_PCG;
  p_Var1->ops->free = SUNLinSolFree_PCG;
  piVar2 = (int *)malloc(0x70);
  p_Var1->content = piVar2;
  piVar2[6] = 0;
  *piVar2 = local_10;
  piVar2[1] = local_c;
  piVar2[2] = 0;
  piVar2[3] = 0;
  piVar2[4] = 0;
  piVar2[5] = 0;
  piVar2[0x14] = 0;
  piVar2[0x15] = 0;
  piVar2[0x16] = 0;
  piVar2[0x17] = 0;
  piVar2[0x18] = 0;
  piVar2[0x19] = 0;
  piVar2[0x1a] = 0;
  piVar2[0x1b] = 0;
  piVar2[0x12] = 0;
  piVar2[0x13] = 0;
  piVar2[8] = 0;
  piVar2[9] = 0;
  piVar2[10] = 0;
  piVar2[0xb] = 0;
  piVar2[0xc] = 0;
  piVar2[0xd] = 0;
  piVar2[0xe] = 0;
  piVar2[0xf] = 0;
  piVar2[0x10] = 0;
  piVar2[0x11] = 0;
  uVar3 = N_VClone(in_RDI);
  *(undefined8 *)(piVar2 + 0x14) = uVar3;
  uVar3 = N_VClone(in_RDI);
  *(undefined8 *)(piVar2 + 0x16) = uVar3;
  uVar3 = N_VClone(in_RDI);
  *(undefined8 *)(piVar2 + 0x18) = uVar3;
  uVar3 = N_VClone(in_RDI);
  *(undefined8 *)(piVar2 + 0x1a) = uVar3;
  return p_Var1;
}

Assistant:

SUNLinearSolver SUNLinSol_PCG(N_Vector y, int pretype, int maxl, SUNContext sunctx)
{
  SUNFunctionBegin(sunctx);
  SUNLinearSolver S;
  SUNLinearSolverContent_PCG content;

  /* check for legal pretype and maxl values; if illegal use defaults */
  if ((pretype != SUN_PREC_NONE) && (pretype != SUN_PREC_LEFT) &&
      (pretype != SUN_PREC_RIGHT) && (pretype != SUN_PREC_BOTH))
  {
    pretype = SUN_PREC_NONE;
  }
  if (maxl <= 0) { maxl = SUNPCG_MAXL_DEFAULT; }

  /* Create linear solver */
  S = NULL;
  S = SUNLinSolNewEmpty(sunctx);
  SUNCheckLastErrNull();

  /* Attach operations */
  S->ops->gettype           = SUNLinSolGetType_PCG;
  S->ops->getid             = SUNLinSolGetID_PCG;
  S->ops->setatimes         = SUNLinSolSetATimes_PCG;
  S->ops->setpreconditioner = SUNLinSolSetPreconditioner_PCG;
  S->ops->setscalingvectors = SUNLinSolSetScalingVectors_PCG;
  S->ops->setzeroguess      = SUNLinSolSetZeroGuess_PCG;
  S->ops->initialize        = SUNLinSolInitialize_PCG;
  S->ops->setup             = SUNLinSolSetup_PCG;
  S->ops->solve             = SUNLinSolSolve_PCG;
  S->ops->numiters          = SUNLinSolNumIters_PCG;
  S->ops->resnorm           = SUNLinSolResNorm_PCG;
  S->ops->resid             = SUNLinSolResid_PCG;
  S->ops->lastflag          = SUNLinSolLastFlag_PCG;
  S->ops->space             = SUNLinSolSpace_PCG;
  S->ops->free              = SUNLinSolFree_PCG;

  /* Create content */
  content = NULL;
  content = (SUNLinearSolverContent_PCG)malloc(sizeof *content);
  SUNAssertNull(content, SUN_ERR_MALLOC_FAIL);

  /* Attach content  */
  S->content = content;

  /* Fill content */
  content->last_flag = 0;
  content->maxl      = maxl;
  content->pretype   = pretype;
  content->zeroguess = SUNFALSE;
  content->numiters  = 0;
  content->resnorm   = ZERO;
  content->r         = NULL;
  content->p         = NULL;
  content->z         = NULL;
  content->Ap        = NULL;
  content->s         = NULL;
  content->ATimes    = NULL;
  content->ATData    = NULL;
  content->Psetup    = NULL;
  content->Psolve    = NULL;
  content->PData     = NULL;

  /* Allocate content */
  content->r = N_VClone(y);
  SUNCheckLastErrNull();

  content->p = N_VClone(y);
  SUNCheckLastErrNull();

  content->z = N_VClone(y);
  SUNCheckLastErrNull();

  content->Ap = N_VClone(y);
  SUNCheckLastErrNull();

  return (S);
}